

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

string * __thiscall
t_haxe_generator::function_signature_combined_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_function *tfunction)

{
  bool bVar1;
  uint uVar2;
  t_struct *tstruct;
  t_type *ptVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string resulttype;
  string arguments;
  string local_60;
  undefined1 local_40 [8];
  string on_error_success;
  t_function *tfunction_local;
  t_haxe_generator *this_local;
  string *result;
  
  on_error_success.field_2._8_8_ = tfunction;
  generate_service_method_onsuccess_abi_cxx11_(&local_60,this,tfunction,true,false);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "onError : Dynamic->Void = null, ",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  tstruct = t_function::get_arglist((t_function *)on_error_success.field_2._8_8_);
  argument_list_abi_cxx11_((string *)((long)&resulttype.field_2 + 8),this,tstruct);
  bVar1 = t_function::is_oneway((t_function *)on_error_success.field_2._8_8_);
  if (!bVar1) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&resulttype.field_2 + 8),"");
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)(resulttype.field_2._M_local_buf + 8),", ");
    }
    std::__cxx11::string::operator+=
              ((string *)(resulttype.field_2._M_local_buf + 8),(string *)local_40);
  }
  std::__cxx11::string::string((string *)local_b0);
  bVar1 = t_function::is_oneway((t_function *)on_error_success.field_2._8_8_);
  if (!bVar1) {
    ptVar3 = t_function::get_returntype((t_function *)on_error_success.field_2._8_8_);
    uVar2 = (*(ptVar3->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      ptVar3 = t_function::get_returntype((t_function *)on_error_success.field_2._8_8_);
      type_name_abi_cxx11_(&local_d0,this,ptVar3,false,false);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      goto LAB_002ee808;
    }
  }
  std::__cxx11::string::operator=((string *)local_b0,"Void");
LAB_002ee808:
  local_d1 = 0;
  __rhs = t_function::get_name_abi_cxx11_((t_function *)on_error_success.field_2._8_8_);
  std::operator+(&local_158,"function ",__rhs);
  std::operator+(&local_138,&local_158,"(");
  std::operator+(&local_118,&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&resulttype.field_2 + 8));
  std::operator+(&local_f8,&local_118,") : ");
  std::operator+(__return_storage_ptr__,&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  local_d1 = 1;
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(resulttype.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::function_signature_combined(t_function* tfunction) {
  std::string on_error_success = "onError : Dynamic->Void = null, "
                                 + generate_service_method_onsuccess(tfunction, true, false);

  std::string arguments = argument_list(tfunction->get_arglist());
  if (!tfunction->is_oneway()) {
    if (arguments != "") {
      arguments += ", ";
    }
    arguments += on_error_success; //"onError : Function, onSuccess : Function";
  }

  std::string resulttype;
  if (tfunction->is_oneway() || tfunction->get_returntype()->is_void()) {
    resulttype = "Void";
  } else {
    resulttype = type_name(tfunction->get_returntype());
  }

  std::string result = "function " + tfunction->get_name() + "(" + arguments + ") : "+resulttype;
  return result;
}